

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

void av1_mc_flow_dispenser_mt(AV1_COMP *cpi)

{
  AV1TplRowMultiThreadSync *tpl_sync;
  ThreadData_conflict *__src;
  uint uVar1;
  AV1_PRIMARY *pAVar2;
  EncWorkerData *pEVar3;
  long lVar4;
  AVxWorker *pAVar5;
  undefined1 *puVar6;
  int iVar7;
  pthread_mutex_t *ppVar8;
  pthread_cond_t *ppVar9;
  int *piVar10;
  void *pvVar11;
  AVxWorkerInterface *pAVar12;
  ulong uVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  ThreadData_conflict *__dest;
  AVxWorker *pAVar17;
  int iVar18;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  aom_internal_error_info error_info;
  aom_internal_error_info local_1d0;
  uint uVar19;
  
  pAVar2 = cpi->ppi;
  uVar21 = (cpi->common).mi_params.mb_rows;
  lVar22 = (long)(int)uVar21;
  uVar19 = (cpi->mt_info).num_mod_workers[2];
  uVar1 = (cpi->mt_info).num_workers;
  if ((int)uVar19 < (int)uVar1) {
    uVar1 = uVar19;
  }
  uVar13 = (ulong)uVar1;
  if (uVar21 != (pAVar2->tpl_data).tpl_mt_sync.rows) {
    tpl_sync = &(pAVar2->tpl_data).tpl_mt_sync;
    av1_tpl_dealloc(tpl_sync);
    (pAVar2->tpl_data).tpl_mt_sync.rows = uVar21;
    ppVar8 = (pthread_mutex_t *)aom_malloc(lVar22 * 0x28);
    (pAVar2->tpl_data).tpl_mt_sync.mutex_ = ppVar8;
    if (ppVar8 == (pthread_mutex_t *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate tpl_sync->mutex_");
    }
    if ((0 < (int)uVar21) && (tpl_sync->mutex_ != (pthread_mutex_t *)0x0)) {
      lVar15 = 0;
      do {
        pthread_mutex_init((pthread_mutex_t *)((long)tpl_sync->mutex_ + lVar15),
                           (pthread_mutexattr_t *)0x0);
        lVar15 = lVar15 + 0x28;
      } while ((ulong)uVar21 * 0x28 != lVar15);
    }
    ppVar9 = (pthread_cond_t *)aom_malloc(lVar22 * 0x30);
    (pAVar2->tpl_data).tpl_mt_sync.cond_ = ppVar9;
    if (ppVar9 == (pthread_cond_t *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate tpl_sync->cond_");
    }
    if ((0 < (int)uVar21) && ((pAVar2->tpl_data).tpl_mt_sync.cond_ != (pthread_cond_t *)0x0)) {
      lVar15 = 0;
      do {
        pthread_cond_init((pthread_cond_t *)((long)(pAVar2->tpl_data).tpl_mt_sync.cond_ + lVar15),
                          (pthread_condattr_t *)0x0);
        lVar15 = lVar15 + 0x30;
      } while ((ulong)uVar21 * 0x30 != lVar15);
    }
    piVar10 = (int *)aom_malloc(lVar22 * 4);
    (pAVar2->tpl_data).tpl_mt_sync.num_finished_cols = piVar10;
    if (piVar10 == (int *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate tpl_sync->num_finished_cols");
    }
    (pAVar2->tpl_data).tpl_mt_sync.sync_range = 1;
  }
  (pAVar2->tpl_data).tpl_mt_sync.num_threads_working = uVar1;
  (cpi->mt_info).tpl_row_mt.tpl_mt_exit = false;
  memset((pAVar2->tpl_data).tpl_mt_sync.num_finished_cols,0xff,lVar22 << 2);
  if (0 < (int)uVar1) {
    __src = &cpi->td;
    lVar22 = uVar13 + 1;
    lVar15 = uVar13 * 0x1d0;
    lVar16 = uVar13 * 0x38;
    uVar21 = uVar1;
    do {
      uVar21 = uVar21 - 1;
      pAVar17 = (cpi->mt_info).workers;
      pEVar3 = (cpi->mt_info).tile_thr_data;
      pcVar14 = pEVar3[-1].error_info.detail + lVar15 + -0x20;
      *(code **)((long)pAVar17 + lVar16 + -0x20) = tpl_worker_hook;
      *(char **)((long)pAVar17 + lVar16 + -0x18) = pcVar14;
      *(undefined8 *)((long)pAVar17 + lVar16 + -0x10) = 0;
      *(uint *)((pEVar3->error_info).detail + lVar15 + -0x24) = uVar21;
      *(uint *)((pEVar3->error_info).detail + lVar15 + -0x28) = uVar21;
      *(AV1_COMP **)pcVar14 = cpi;
      __dest = __src;
      if (lVar15 != 0x1d0) {
        __dest = *(ThreadData_conflict **)((long)pEVar3 + lVar15 + -0x1c0);
      }
      *(ThreadData_conflict **)((long)pEVar3 + lVar15 + -0x1c8) = __dest;
      if (__dest != __src) {
        memcpy(__dest,__src,0x256b0);
        av1_init_obmc_buffer((OBMCBuffer *)(*(long *)((long)pEVar3 + lVar15 + -0x1c8) + 0x41a0));
        lVar4 = *(long *)((long)pEVar3 + lVar15 + -0x1c8);
        uVar19 = (uint)(cpi->ppi->tpl_data).tpl_bsize_1d;
        iVar18 = uVar19 * uVar19;
        uVar20 = (ulong)(uint)(iVar18 * 2);
        pvVar11 = aom_memalign(0x20,uVar20);
        *(void **)(lVar4 + 0x25dc0) = pvVar11;
        pvVar11 = aom_memalign(0x20,uVar20);
        *(void **)(lVar4 + 0x25dc8) = pvVar11;
        uVar20 = (ulong)(uint)(iVar18 * 4);
        pvVar11 = aom_memalign(0x20,uVar20);
        *(void **)(lVar4 + 0x25dd0) = pvVar11;
        pvVar11 = aom_memalign(0x20,uVar20);
        *(void **)(lVar4 + 0x25dd8) = pvVar11;
        pvVar11 = aom_memalign(0x20,uVar20);
        *(void **)(lVar4 + 0x25de0) = pvVar11;
        if ((((*(void **)(lVar4 + 0x25dc0) == (void *)0x0) || (*(long *)(lVar4 + 0x25dc8) == 0)) ||
            (*(long *)(lVar4 + 0x25dd0) == 0)) ||
           ((*(long *)(lVar4 + 0x25dd8) == 0 || (pvVar11 == (void *)0x0)))) {
          aom_free(*(void **)(lVar4 + 0x25dc0));
          *(undefined8 *)(lVar4 + 0x25dc0) = 0;
          aom_free(*(void **)(lVar4 + 0x25dc8));
          *(undefined8 *)(lVar4 + 0x25dc8) = 0;
          aom_free(*(void **)(lVar4 + 0x25dd0));
          *(undefined8 *)(lVar4 + 0x25dd0) = 0;
          aom_free(*(void **)(lVar4 + 0x25dd8));
          *(undefined8 *)(lVar4 + 0x25dd8) = 0;
          aom_free(*(void **)(lVar4 + 0x25de0));
          *(undefined8 *)(lVar4 + 0x25de0) = 0;
          aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Error allocating tpl data");
        }
        lVar4 = *(long *)((long)pEVar3 + lVar15 + -0x1c8);
        *(undefined8 *)(lVar4 + 0x41f0) = *(undefined8 *)(lVar4 + 0x25d28);
        *(undefined8 *)(lVar4 + 0x3c58) = *(undefined8 *)(lVar4 + 0x25d28);
      }
      lVar22 = lVar22 + -1;
      lVar15 = lVar15 + -0x1d0;
      lVar16 = lVar16 + -0x38;
    } while (1 < lVar22);
  }
  pAVar12 = aom_get_worker_interface();
  if (0 < (int)uVar1) {
    lVar22 = uVar13 + 1;
    lVar15 = uVar13 * 0x38;
    do {
      pAVar17 = (cpi->mt_info).workers;
      *(undefined4 *)((long)&pAVar17[-1].had_error + lVar15) = 0;
      pAVar17 = (AVxWorker *)((long)&pAVar17[-1].impl_ + lVar15);
      if (lVar22 == 2) {
        (*pAVar12->execute)(pAVar17);
      }
      else {
        (*pAVar12->launch)(pAVar17);
      }
      lVar22 = lVar22 + -1;
      lVar15 = lVar15 + -0x38;
    } while (1 < lVar22);
  }
  pAVar12 = aom_get_worker_interface();
  pAVar17 = (cpi->mt_info).workers;
  iVar18 = pAVar17->had_error;
  if (iVar18 != 0) {
    memcpy(&local_1d0,(void *)((long)pAVar17->data1 + 0x18),0x1a0);
  }
  if (1 < (int)uVar1) {
    lVar22 = uVar13 + 1;
    lVar15 = uVar13 * 0x38;
    do {
      pAVar5 = (cpi->mt_info).workers;
      iVar7 = (*pAVar12->sync)((AVxWorker *)((long)&pAVar5[-1].impl_ + lVar15));
      if (iVar7 == 0) {
        memcpy(&local_1d0,(void *)(*(long *)((long)&pAVar5[-1].data1 + lVar15) + 0x18),0x1a0);
        iVar18 = 1;
      }
      lVar22 = lVar22 + -1;
      lVar15 = lVar15 + -0x38;
    } while (2 < lVar22);
  }
  if (iVar18 != 0) {
    aom_internal_error_copy((cpi->common).error,&local_1d0);
  }
  *(aom_internal_error_info **)(*(long *)((long)pAVar17->data1 + 8) + 0x2b90) = (cpi->common).error;
  if (0 < (int)uVar1) {
    lVar22 = uVar13 + 1;
    lVar15 = uVar13 * 0x1d0 + -0x1c8;
    do {
      puVar6 = *(undefined1 **)
                ((((cpi->mt_info).tile_thr_data)->error_info).detail + lVar15 + -0x20);
      if ((ThreadData_conflict *)puVar6 != &cpi->td) {
        aom_free(*(void **)(puVar6 + 0x25dc0));
        *(undefined8 *)(puVar6 + 0x25dc0) = 0;
        aom_free(*(void **)(puVar6 + 0x25dc8));
        *(undefined8 *)(puVar6 + 0x25dc8) = 0;
        aom_free(*(void **)(puVar6 + 0x25dd0));
        *(undefined8 *)(puVar6 + 0x25dd0) = 0;
        aom_free(*(void **)(puVar6 + 0x25dd8));
        *(undefined8 *)(puVar6 + 0x25dd8) = 0;
        aom_free(*(void **)(puVar6 + 0x25de0));
        *(undefined8 *)(puVar6 + 0x25de0) = 0;
      }
      lVar22 = lVar22 + -1;
      lVar15 = lVar15 + -0x1d0;
    } while (1 < lVar22);
  }
  return;
}

Assistant:

void av1_mc_flow_dispenser_mt(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;
  CommonModeInfoParams *mi_params = &cm->mi_params;
  MultiThreadInfo *mt_info = &cpi->mt_info;
  TplParams *tpl_data = &cpi->ppi->tpl_data;
  AV1TplRowMultiThreadSync *tpl_sync = &tpl_data->tpl_mt_sync;
  int mb_rows = mi_params->mb_rows;
  int num_workers =
      AOMMIN(mt_info->num_mod_workers[MOD_TPL], mt_info->num_workers);

  if (mb_rows != tpl_sync->rows) {
    av1_tpl_dealloc(tpl_sync);
    av1_tpl_alloc(tpl_sync, cm, mb_rows);
  }
  tpl_sync->num_threads_working = num_workers;
  mt_info->tpl_row_mt.tpl_mt_exit = false;

  // Initialize cur_mb_col to -1 for all MB rows.
  memset(tpl_sync->num_finished_cols, -1,
         sizeof(*tpl_sync->num_finished_cols) * mb_rows);

  prepare_tpl_workers(cpi, tpl_worker_hook, num_workers);
  launch_workers(&cpi->mt_info, num_workers);
  sync_enc_workers(&cpi->mt_info, cm, num_workers);
#if CONFIG_BITRATE_ACCURACY
  tpl_accumulate_txfm_stats(&cpi->td, &cpi->mt_info, num_workers);
#endif  // CONFIG_BITRATE_ACCURACY
  for (int i = num_workers - 1; i >= 0; i--) {
    EncWorkerData *thread_data = &mt_info->tile_thr_data[i];
    ThreadData *td = thread_data->td;
    if (td != &cpi->td) tpl_dealloc_temp_buffers(&td->tpl_tmp_buffers);
  }
}